

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O3

void __thiscall
ruckig::BrakeProfile::acceleration_brake
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double aMax,double aMin,
          double jMax)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  
  (this->j)._M_elems[0] = -jMax;
  dVar9 = (a0 - (a0 / jMax) * jMax * 0.5) * (a0 / jMax) + v0;
  if (((jMax <= -jMax) || (dVar9 <= vMax)) && ((0.0 <= jMax || (vMax <= dVar9)))) {
    dVar9 = (a0 - aMax) / jMax;
    dVar2 = (a0 - dVar9 * jMax * 0.5) * dVar9 + v0;
    if ((jMax <= 0.0 || vMin <= dVar2) && (0.0 <= jMax || dVar2 <= vMin)) {
      (this->t)._M_elems[0] = dVar9 + 2.2e-14;
      return;
    }
    dVar8 = -(dVar2 - vMin) / aMax;
    auVar5._0_8_ = -aMax;
    auVar5._8_8_ = dVar2 - vMax;
    auVar6._8_8_ = aMax;
    auVar6._0_8_ = jMax + jMax;
    auVar6 = divpd(auVar5,auVar6);
    dVar2 = (auVar6._0_8_ - auVar6._8_8_) + -2.2e-14;
    (this->t)._M_elems[0] = dVar9 + 2.2e-14;
    if (dVar8 <= dVar2) {
      dVar2 = dVar8;
    }
    dVar9 = 0.0;
    if (0.0 <= dVar2) {
      dVar9 = dVar2;
    }
    (this->t)._M_elems[1] = dVar9;
    return;
  }
  (this->j)._M_elems[0] = -jMax;
  dVar9 = (v0 - vMax) * (jMax + jMax) + a0 * a0;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar8 = (a0 - aMin) / jMax;
  dVar2 = (v0 - vMin) * jMax + a0 * a0 * 0.5;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  auVar3._8_8_ = dVar2;
  auVar3._0_8_ = a0;
  auVar1._8_8_ = ABS(jMax);
  auVar1._0_8_ = jMax;
  auVar6 = divpd(auVar3,auVar1);
  dVar9 = dVar9 / ABS(jMax) + auVar6._0_8_;
  dVar2 = auVar6._8_8_ + auVar6._0_8_;
  if (dVar9 <= dVar2) {
    dVar2 = dVar9;
  }
  if (dVar2 <= dVar8) {
    dVar9 = 0.0;
    if (0.0 <= dVar2 + -2.2e-14) {
      dVar9 = dVar2 + -2.2e-14;
    }
  }
  else {
    dVar2 = (-jMax * dVar8 * 0.5 + a0) * dVar8 + v0;
    dVar9 = -(dVar2 - vMax) / aMin;
    auVar7._8_8_ = aMin;
    auVar7._0_8_ = jMax + jMax;
    auVar4._8_8_ = dVar2 - vMin;
    auVar4._0_8_ = aMin;
    auVar6 = divpd(auVar4,auVar7);
    dVar2 = auVar6._0_8_ - auVar6._8_8_;
    if (dVar9 <= dVar2) {
      dVar2 = dVar9;
    }
    dVar9 = 0.0;
    if (0.0 <= dVar8 + -2.2e-14) {
      dVar9 = dVar8 + -2.2e-14;
    }
    dVar8 = 0.0;
    if (0.0 <= dVar2) {
      dVar8 = dVar2;
    }
    (this->t)._M_elems[1] = dVar8;
  }
  (this->t)._M_elems[0] = dVar9;
  return;
}

Assistant:

void BrakeProfile::acceleration_brake(double v0, double a0, double vMax, double vMin, double aMax, double aMin, double jMax) {
    j[0] = -jMax;

    const double t_to_a_max = (a0 - aMax) / jMax;
    const double t_to_a_zero = a0 / jMax;

    const double v_at_a_max = v_at_t(v0, a0, -jMax, t_to_a_max);
    const double v_at_a_zero = v_at_t(v0, a0, -jMax, t_to_a_zero);

    if ((v_at_a_zero > vMax && jMax > 0) || (v_at_a_zero < vMax && jMax < 0)) {
        velocity_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if ((v_at_a_max < vMin && jMax > 0) || (v_at_a_max > vMin && jMax < 0)) {
        const double t_to_v_min = -(v_at_a_max - vMin)/aMax;
        const double t_to_v_max = -aMax/(2*jMax) - (v_at_a_max - vMax)/aMax;

        t[0] = t_to_a_max + eps;
        t[1] = std::max(std::min(t_to_v_min, t_to_v_max - eps), 0.0);

    } else {
        t[0] = t_to_a_max + eps;
    }
}